

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemDependenceGraph.cpp
# Opt level: O0

void __thiscall dg::llvmdg::SDGBuilder::buildFuns(SDGBuilder *this)

{
  bool bVar1;
  ulong uVar2;
  DependenceGraph *in_RDI;
  SDGBuilder *unaff_retaddr;
  DependenceGraph *g;
  Function *F;
  iterator __end2;
  iterator __begin2;
  Module *__range2;
  DependenceGraph *in_stack_ffffffffffffffd0;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_false>
  local_20;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_false>
  local_18;
  Function *F_00;
  DependenceGraph *dg;
  
  F_00 = (Function *)in_RDI->_sdg;
  dg = in_RDI;
  local_18.NodePtr = (node_pointer)llvm::Module::begin((Module *)in_RDI);
  local_20.NodePtr = (node_pointer)llvm::Module::end((Module *)in_RDI);
  while (bVar1 = llvm::operator!=(&local_18,&local_20), bVar1) {
    llvm::
    ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_false>
    ::operator*((ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_false>
                 *)0x133068);
    uVar2 = llvm::GlobalValue::isDeclaration();
    if ((uVar2 & 1) == 0) {
      in_stack_ffffffffffffffd0 = getOrCreateDG((SDGBuilder *)__range2,(Function *)__begin2.NodePtr)
      ;
      buildDG(unaff_retaddr,dg,F_00);
    }
    llvm::
    ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_false>
    ::operator++((ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_false>
                  *)in_stack_ffffffffffffffd0);
  }
  return;
}

Assistant:

void buildFuns() {
        DBG_SECTION_BEGIN(sdg, "Building functions");
        // build dependence graph for each procedure
        for (auto &F : *_module) {
            if (F.isDeclaration()) {
                continue;
            }

            auto &g = getOrCreateDG(&F);
            buildDG(g, F);
        }
        DBG_SECTION_END(sdg, "Done building functions");
    }